

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O2

bool anon_unknown.dwarf_26b4a1::HandleConvertCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  pointer pbVar1;
  pointer pbVar2;
  bool bVar3;
  NormalizeOption NVar4;
  int iVar5;
  char *pcVar6;
  string *this;
  pointer this_00;
  basic_string_view<char,_std::char_traits<char>_> __y;
  basic_string_view<char,_std::char_traits<char>_> __y_00;
  basic_string_view<char,_std::char_traits<char>_> __y_01;
  basic_string_view<char,_std::char_traits<char>_> __y_02;
  basic_string_view<char,_std::char_traits<char>_> __y_03;
  basic_string_view<char,_std::char_traits<char>_> __y_04;
  string_view separator;
  string_view value_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_01;
  string_view arg;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_03;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x_04;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  cmAlphaNum local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((long)(args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5) - 6U <
      0xfffffffffffffffe) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value,"CONVERT must be called with three or four arguments.",
               (allocator<char> *)&local_80);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
  else {
    __y._M_str = "TO_CMAKE_PATH_LIST";
    __y._M_len = 0x12;
    __x._M_str = pbVar1[2]._M_dataplus._M_p;
    __x._M_len = pbVar1[2]._M_string_length;
    bVar3 = std::operator!=(__x,__y);
    if ((bVar3) &&
       (__y_00._M_str = "TO_NATIVE_PATH_LIST", __y_00._M_len = 0x13,
       __x_00._M_str = pbVar1[2]._M_dataplus._M_p, __x_00._M_len = pbVar1[2]._M_string_length,
       bVar3 = std::operator!=(__x_00,__y_00), bVar3)) {
      value._M_dataplus._M_p = (pointer)0x27;
      value._M_string_length = (size_type)anon_var_dwarf_286ca2;
      local_80.View_._M_str = pbVar1[2]._M_dataplus._M_p;
      local_80.View_._M_len = pbVar1[2]._M_string_length;
      cmStrCat<char[2]>((string *)&paths,(cmAlphaNum *)&value,&local_80,(char (*) [2])0x59ee35);
      std::__cxx11::string::_M_assign((string *)&status->Error);
      this = (string *)&paths;
      goto LAB_00199220;
    }
    if ((args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start[3]._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&value,"Invalid name for output variable.",(allocator<char> *)&local_80);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      if (((anonymous_namespace)::
           HandleConvertCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
           ::parser == '\0') &&
         (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                       HandleConvertCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                       ::parser), iVar5 != 0)) {
        NormalizeParser::NormalizeParser(&HandleConvertCommand::parser);
        __cxa_atexit(CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>::
                     ~CMakePathArgumentParser,&HandleConvertCommand::parser,&__dso_handle);
        __cxa_guard_release(&(anonymous_namespace)::
                             HandleConvertCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                             ::parser);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&HandleConvertCommand::parser.
               super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>.Inputs);
      value._M_string_length =
           (size_type)
           (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
      value._M_dataplus._M_p =
           (pointer)((args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + 4);
      NVar4 = cmArgumentParser<(anonymous_namespace)::NormalizeOption>::
              Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                        ((cmArgumentParser<(anonymous_namespace)::NormalizeOption> *)
                         &HandleConvertCommand::parser,
                         (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          *)&value,
                         &HandleConvertCommand::parser.
                          super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>.
                          Inputs,value._M_string_length);
      if (HandleConvertCommand::parser.
          super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>.Inputs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          HandleConvertCommand::parser.
          super_CMakePathArgumentParser<(anonymous_namespace)::NormalizeOption>.Inputs.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        paths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        paths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        paths.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        __y_01._M_str = "TO_CMAKE_PATH_LIST";
        __y_01._M_len = 0x12;
        __x_01._M_str = pbVar1[2]._M_dataplus._M_p;
        __x_01._M_len = pbVar1[2]._M_string_length;
        bVar3 = std::operator==(__x_01,__y_01);
        if (bVar3) {
          cmsys::SystemTools::SplitString
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&value,
                     (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + 1,':',false);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_move_assign(&paths,&value);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&value);
        }
        else {
          pbVar2 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          arg._M_str = pbVar2[1]._M_dataplus._M_p;
          arg._M_len = pbVar2[1]._M_string_length;
          cmExpandList(arg,&paths,false);
        }
        pbVar2 = paths.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (this_00 = paths.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; this_00 != pbVar2;
            this_00 = this_00 + 1) {
          std::__cxx11::string::string((string *)&local_50,(string *)this_00);
          __y_02._M_str = "TO_CMAKE_PATH_LIST";
          __y_02._M_len = 0x12;
          __x_02._M_str = pbVar1[2]._M_dataplus._M_p;
          __x_02._M_len = pbVar1[2]._M_string_length;
          bVar3 = std::operator==(__x_02,__y_02);
          cmCMakePath::cmCMakePath<std::__cxx11::string,cmCMakePath&>
                    ((cmCMakePath *)&value,&local_50,!bVar3);
          std::__cxx11::string::~string((string *)&local_50);
          if ((NVar4.Normalize & 1U) != 0) {
            cmCMakePath::Normal((cmCMakePath *)&local_80,(cmCMakePath *)&value);
            cmCMakePath::operator=((cmCMakePath *)&value,(cmCMakePath *)&local_80);
            std::filesystem::__cxx11::path::~path((path *)&local_80);
          }
          __y_03._M_str = "TO_CMAKE_PATH_LIST";
          __y_03._M_len = 0x12;
          __x_03._M_str = pbVar1[2]._M_dataplus._M_p;
          __x_03._M_len = pbVar1[2]._M_string_length;
          bVar3 = std::operator==(__x_03,__y_03);
          if (bVar3) {
            std::filesystem::__cxx11::path::generic_string((string *)&local_80,(path *)&value);
          }
          else {
            cmCMakePath::NativeString_abi_cxx11_((string *)&local_80,(cmCMakePath *)&value);
          }
          std::__cxx11::string::operator=((string *)this_00,(string *)&local_80);
          std::__cxx11::string::~string((string *)&local_80);
          std::filesystem::__cxx11::path::~path((path *)&value);
        }
        __y_04._M_str = "TO_CMAKE_PATH_LIST";
        __y_04._M_len = 0x12;
        __x_04._M_str = pbVar1[2]._M_dataplus._M_p;
        __x_04._M_len = pbVar1[2]._M_string_length;
        bVar3 = std::operator==(__x_04,__y_04);
        pcVar6 = ":";
        if (bVar3) {
          pcVar6 = ";";
        }
        separator._M_str = pcVar6;
        separator._M_len = 1;
        cmJoin(&value,&paths,separator,(string_view)ZEXT816(0));
        value_00._M_str = value._M_dataplus._M_p;
        value_00._M_len = value._M_string_length;
        cmMakefile::AddDefinition
                  (status->Makefile,
                   (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 3,value_00);
        std::__cxx11::string::~string((string *)&value);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&paths);
        return true;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&value,"CONVERT called with unexpected arguments.",
                 (allocator<char> *)&local_80);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
  }
  this = &value;
LAB_00199220:
  std::__cxx11::string::~string((string *)this);
  return false;
}

Assistant:

bool HandleConvertCommand(std::vector<std::string> const& args,
                          cmExecutionStatus& status)
{
#if defined(_WIN32) && !defined(__CYGWIN__)
  const auto pathSep = ";"_s;
#else
  const auto pathSep = ":"_s;
#endif
  const auto cmakePath = "TO_CMAKE_PATH_LIST"_s;
  const auto nativePath = "TO_NATIVE_PATH_LIST"_s;

  if (args.size() < 4 || args.size() > 5) {
    status.SetError("CONVERT must be called with three or four arguments.");
    return false;
  }

  const auto& action = args[2];

  if (action != cmakePath && action != nativePath) {
    status.SetError(
      cmStrCat("CONVERT called with an unknown action: ", action, "."));
    return false;
  }

  if (args[3].empty()) {
    status.SetError("Invalid name for output variable.");
    return false;
  }

  static NormalizeParser const parser;

  const auto arguments = parser.Parse<4>(args);

  if (!parser.GetInputs().empty()) {
    status.SetError("CONVERT called with unexpected arguments.");
    return false;
  }

  std::vector<std::string> paths;

  if (action == cmakePath) {
    paths = cmSystemTools::SplitString(args[1], pathSep.front());
  } else {
    cmExpandList(args[1], paths);
  }

  for (auto& path : paths) {
    auto p = cmCMakePath(path,
                         action == cmakePath ? cmCMakePath::native_format
                                             : cmCMakePath::generic_format);
    if (arguments.Normalize) {
      p = p.Normal();
    }
    if (action == cmakePath) {
      path = p.GenericString();
    } else {
      path = p.NativeString();
    }
  }

  auto value = cmJoin(paths, action == cmakePath ? ";"_s : pathSep);
  status.GetMakefile().AddDefinition(args[3], value);

  return true;
}